

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

int __thiscall
TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_>::ClassId
          (TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  allocator<char> local_221;
  string local_220;
  TPZFileEqnStorage<float> local_200;
  TPZFrontNonSym<float> local_148;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"TPZFrontMatrix",&local_221);
  uVar1 = Hash(&local_220);
  iVar2 = TPZAbstractFrontMatrix<float>::ClassId(&this->super_TPZAbstractFrontMatrix<float>);
  TPZFileEqnStorage<float>::TPZFileEqnStorage(&local_200);
  iVar3 = TPZFileEqnStorage<float>::ClassId(&local_200);
  TPZFrontNonSym<float>::TPZFrontNonSym(&local_148);
  iVar4 = TPZFrontNonSym<float>::ClassId(&local_148);
  TPZFrontNonSym<float>::~TPZFrontNonSym(&local_148);
  TPZFileEqnStorage<float>::~TPZFileEqnStorage(&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  return iVar4 << 3 ^ iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::ClassId() const{
    return Hash("TPZFrontMatrix") ^ TPZAbstractFrontMatrix<TVar>::ClassId() << 1 ^ store().ClassId() << 2 ^ front().ClassId() << 3;
}